

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

char * conc(vector<char> *buf,tagval *v,int n,bool space,char *prefix,int prefixlen)

{
  size_t sVar1;
  char *pcVar2;
  char local_46 [2];
  uint local_44;
  char *pcStack_40;
  int len;
  char *s;
  char local_2d;
  int i;
  char *pcStack_28;
  int prefixlen_local;
  char *prefix_local;
  bool space_local;
  tagval *ptStack_18;
  int n_local;
  tagval *v_local;
  vector<char> *buf_local;
  
  i = prefixlen;
  pcStack_28 = prefix;
  prefix_local._3_1_ = space;
  prefix_local._4_4_ = n;
  ptStack_18 = v;
  v_local = (tagval *)buf;
  if (((prefix != (char *)0x0) &&
      (vector<char>::put(buf,prefix,prefixlen), (prefix_local._3_1_ & 1) != 0)) &&
     (prefix_local._4_4_ != 0)) {
    local_2d = ' ';
    vector<char>::add((vector<char> *)v_local,&local_2d);
  }
  for (s._4_4_ = 0; s._4_4_ < prefix_local._4_4_; s._4_4_ = s._4_4_ + 1) {
    pcStack_40 = "";
    local_44 = 0;
    switch(ptStack_18[s._4_4_].type) {
    case 1:
      pcStack_40 = intstr(ptStack_18[s._4_4_].super_identval.field_0.i);
      break;
    case 2:
      pcStack_40 = floatstr(ptStack_18[s._4_4_].super_identval.field_0.f);
      break;
    case 3:
      pcStack_40 = ptStack_18[s._4_4_].super_identval.field_0.s;
      break;
    case 6:
      pcStack_40 = ptStack_18[s._4_4_].super_identval.field_0.s;
      local_44 = *(uint *)(ptStack_18[s._4_4_].super_identval.field_0.s + -4) >> 8;
      goto LAB_00140423;
    }
    sVar1 = strlen(pcStack_40);
    local_44 = (uint)sVar1;
LAB_00140423:
    vector<char>::put((vector<char> *)v_local,pcStack_40,local_44);
    if (s._4_4_ == prefix_local._4_4_ + -1) break;
    if ((prefix_local._3_1_ & 1) != 0) {
      local_46[1] = 0x20;
      vector<char>::add((vector<char> *)v_local,local_46 + 1);
    }
  }
  local_46[0] = '\0';
  vector<char>::add((vector<char> *)v_local,local_46);
  pcVar2 = vector<char>::getbuf((vector<char> *)v_local);
  return pcVar2;
}

Assistant:

static char *conc(vector<char> &buf, tagval *v, int n, bool space, const char *prefix = NULL, int prefixlen = 0)
{
    if(prefix)
    {
        buf.put(prefix, prefixlen);
        if(space && n) buf.add(' ');
    }
    loopi(n)
    {
        const char *s = "";
        int len = 0;
        switch(v[i].type)
        {
            case VAL_INT: s = intstr(v[i].i); break;
            case VAL_FLOAT: s = floatstr(v[i].f); break;
            case VAL_STR: s = v[i].s; break;
            case VAL_MACRO: s = v[i].s; len = v[i].code[-1]>>8; goto haslen;
        }
        len = int(strlen(s));
    haslen:
        buf.put(s, len);
        if(i == n-1) break;
        if(space) buf.add(' ');
    }
    buf.add('\0');
    return buf.getbuf();
}